

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

char * lookup_uname_helper(name_cache_conflict *cache,id_t id)

{
  archive *a;
  int iVar1;
  char *pcVar2;
  size_t __size;
  int *piVar3;
  int r;
  size_t nbuff_size;
  char *nbuff;
  passwd *result;
  passwd pwent;
  id_t id_local;
  name_cache_conflict *cache_local;
  
  pwent.pw_shell._4_4_ = id;
  if (cache->buff_size == 0) {
    cache->buff_size = 0x100;
    pcVar2 = (char *)malloc(cache->buff_size);
    cache->buff = pcVar2;
  }
  if (cache->buff == (char *)0x0) {
    cache_local = (name_cache_conflict *)0x0;
  }
  else {
    while( true ) {
      nbuff = (char *)&result;
      iVar1 = getpwuid_r(pwent.pw_shell._4_4_,(passwd *)&result,cache->buff,cache->buff_size,
                         (passwd **)&nbuff);
      if ((iVar1 == 0) || (iVar1 != 0x22)) break;
      __size = cache->buff_size << 1;
      pcVar2 = (char *)realloc(cache->buff,__size);
      if (pcVar2 == (char *)0x0) break;
      cache->buff = pcVar2;
      cache->buff_size = __size;
    }
    if (iVar1 == 0) {
      if (nbuff == (char *)0x0) {
        cache_local = (name_cache_conflict *)0x0;
      }
      else {
        cache_local = (name_cache_conflict *)strdup(*(char **)nbuff);
      }
    }
    else {
      a = cache->archive;
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,"Can\'t lookup user for id %d",(ulong)pwent.pw_shell._4_4_);
      cache_local = (name_cache_conflict *)0x0;
    }
  }
  return (char *)cache_local;
}

Assistant:

static int
lookup_uname_helper(struct cpio *cpio, const char **name, id_t id)
{
	struct passwd	*pwent;

	(void)cpio; /* UNUSED */

	errno = 0;
	pwent = getpwuid((uid_t)id);
	if (pwent == NULL) {
		if (errno && errno != ENOENT)
			lafe_warnc(errno, "getpwuid(%s) failed",
			    cpio_i64toa((int64_t)id));
		return 1;
	}

	*name = pwent->pw_name;
	return 0;
}